

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O3

void license::issueLicense
               (parsed_options *parsed,variables_map *vm,char **argv,options_description *global)

{
  _Rb_tree_node_base *p_Var1;
  size_type *psVar2;
  type tVar3;
  bool bVar4;
  int iVar5;
  value_semantic *pvVar6;
  options_description_easy_init *poVar7;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar8;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *poVar11;
  ostream *poVar12;
  _Rb_tree_node_base *p_Var13;
  bool base64;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> v;
  string license_name;
  string project_folder;
  License license;
  options_description license_desc;
  bool local_241;
  undefined1 local_240 [8];
  string local_238;
  char **local_218;
  options_description *local_210;
  parsed_options *local_208;
  undefined8 local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  License local_158;
  undefined1 *local_b0 [2];
  undefined1 local_a0 [24];
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  local_88 [24];
  void *local_70;
  undefined4 local_68;
  undefined8 local_60;
  undefined4 local_58;
  undefined8 local_50;
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  local_48 [24];
  
  psVar2 = &local_158.m_private_key._M_string_length;
  local_208 = parsed;
  local_158._vptr_License = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"license issue options","");
  boost::program_options::options_description::options_description
            ((options_description *)local_b0,(string *)&local_158,0x50,0x28);
  if (local_158._vptr_License != (_func_int **)psVar2) {
    operator_delete(local_158._vptr_License);
  }
  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
  local_1f8._M_string_length = 0;
  local_1f8.field_2._M_local_buf[0] = '\0';
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  local_1b8._M_string_length = 0;
  local_1b8.field_2._M_local_buf[0] = '\0';
  local_241 = false;
  local_200 = boost::program_options::options_description::add_options
                        ((options_description *)local_b0);
  pvVar6 = (value_semantic *)boost::program_options::bool_switch(&local_241);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&local_200,"base64,b",pvVar6,
                      "Encode license as base64 for inclusion in environment variables.");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"valid-from",(value_semantic *)ptVar8,
                      "Specify the start of the validity for this license.  Format YYYYMMDD. If not specified defaults to today"
                     );
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"valid-to,e",(value_semantic *)ptVar8,
                      "Specify the expire date for this license.  Format YYYYMMDD. If not specified the license won\'t expire"
                     );
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"client-signature,s",(value_semantic *)ptVar8,
                      "The signature of the hardware that requires the license. It should be in the format XXXX-XXXX-XXXX. If not specified the license won\'t be linked to a specific hardware (eg. demo license)."
                     );
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&local_1f8);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"output-file-name,o",(value_semantic *)ptVar8,
                      "License output file name. May contain / that will be interpreded as subfolders."
                     );
  ptVar9 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                     ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"feature-names,f",(value_semantic *)ptVar9,
                      "Feature names: comma separate list of project features to enable. if not specified will be taken as project name."
                     );
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"primary-key",(value_semantic *)ptVar8,
                      "Primary key location, in case it is not in default folder");
  ptVar8 = boost::program_options::value<std::__cxx11::string>(&local_1b8);
  local_158._vptr_License = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,".","");
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&local_158);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"project-folder,p",(value_semantic *)ptVar8,
                      "path to where project configurations and licenses are stored.");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_240 = (undefined1  [8])&local_238._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_240,"0","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"All Versions","");
  local_218 = argv;
  local_210 = global;
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_240,&local_1d8);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"start-version",(value_semantic *)ptVar8,
                      "Specify the first version of the software this license apply to.");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"0","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"All Versions","");
  ptVar8 = boost::program_options::
           typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
           ::default_value(ptVar8,&local_178,&local_198);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"end-version",(value_semantic *)ptVar8,
                      "Specify the last version of the software this license apply to.");
  ptVar8 = boost::program_options::value<std::__cxx11::string>
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  poVar7 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     (poVar7,"extra-data,x",(value_semantic *)ptVar8,
                      "Specify extra data to be included into the license");
  boost::program_options::options_description_easy_init::operator()
            (poVar7,"help,h","Print this help.");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  if (local_240 != (undefined1  [8])&local_238._M_string_length) {
    operator_delete((void *)local_240);
  }
  if (local_158._vptr_License != (_func_int **)psVar2) {
    operator_delete(local_158._vptr_License);
  }
  local_158._vptr_License = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"license issue","");
  bVar4 = rerunBoostPO(local_208,(options_description *)local_b0,vm,local_218,(string *)&local_158,
                       local_210);
  if (local_158._vptr_License != (_func_int **)psVar2) {
    operator_delete(local_158._vptr_License);
  }
  if (bVar4) {
    pbVar10 = &local_1f8;
    if (local_1f8._M_string_length == 0) {
      pbVar10 = (string *)0x0;
    }
    License::License(&local_158,pbVar10,&local_1b8,local_241);
    for (p_Var13 = *(_Rb_tree_node_base **)(vm + 0x28); p_Var13 != (_Rb_tree_node_base *)(vm + 0x18)
        ; p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13)) {
      p_Var1 = p_Var13 + 1;
      iVar5 = std::__cxx11::string::compare((char *)p_Var1);
      if (((iVar5 != 0) && (iVar5 = std::__cxx11::string::compare((char *)p_Var1), iVar5 != 0)) &&
         (iVar5 = std::__cxx11::string::compare((char *)p_Var1), iVar5 != 0)) {
        pbVar10 = boost::any_cast<std::__cxx11::string>((any *)(p_Var13 + 2));
        if (pbVar10 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          poVar11 = boost::any_cast<boost::optional<std::__cxx11::string>const&>
                              ((any *)(p_Var13 + 2));
          local_240 = (undefined1  [8])((ulong)local_240 & 0xffffffffffffff00);
          if ((poVar11->super_type).m_initialized == true) {
            local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
            tVar3 = (poVar11->super_type).m_storage.dummy_.aligner_;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(local_240 + 8),tVar3,
                       *(long *)((long)&(poVar11->super_type).m_storage.dummy_ + 8) + (long)tVar3);
            local_240[0] = (string)0x1;
            License::add_parameter(&local_158,(string *)p_Var1,(string *)(local_240 + 8));
          }
          else {
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)(p_Var13 + 1),
                                 (long)p_Var13[1]._M_parent);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"not recognized value error",0x1a);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar12 + -0x18) + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
          }
          if ((local_240[0] == (string)0x1) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2)) {
            operator_delete(local_238._M_dataplus._M_p);
          }
        }
        else {
          License::add_parameter(&local_158,(string *)p_Var1,pbVar10);
        }
      }
    }
    License::write_license(&local_158);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"License written ",0x10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x10);
    std::ostream::put(-0x10);
    std::ostream::flush();
    local_158._vptr_License = (_func_int **)&PTR__License_0051ee38;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_158.values_map._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.m_project_folder._M_dataplus._M_p != &local_158.m_project_folder.field_2) {
      operator_delete(local_158.m_project_folder._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.m_feature_names._M_dataplus._M_p != &local_158.m_feature_names.field_2) {
      operator_delete(local_158.m_feature_names._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.m_private_key._M_dataplus._M_p != &local_158.m_private_key.field_2) {
      operator_delete(local_158.m_private_key._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  std::
  vector<boost::shared_ptr<boost::program_options::options_description>,_std::allocator<boost::shared_ptr<boost::program_options::options_description>_>_>
  ::~vector(local_48);
  if (local_70 != (void *)0x0) {
    operator_delete(local_70);
    local_70 = (void *)0x0;
    local_68 = 0;
    local_60 = 0;
    local_58 = 0;
    local_50 = 0;
  }
  std::
  vector<boost::shared_ptr<boost::program_options::option_description>,_std::allocator<boost::shared_ptr<boost::program_options::option_description>_>_>
  ::~vector(local_88);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0]);
  }
  return;
}

Assistant:

static void issueLicense(const po::parsed_options &parsed, po::variables_map &vm, const char **argv,
						 const po::options_description &global) {
	po::options_description license_desc("license issue options");
	string license_name;
	string *license_name_ptr = nullptr;
	string project_folder;
	// string output;
	unsigned int magic_num = 0;
	bool base64 = false;
	license_desc.add_options()	//
		(PARAM_BASE64 ",b", po::bool_switch(&base64),
		 "Encode license as base64 for inclusion in environment variables.")  //
		(PARAM_BEGIN_DATE, po::value<string>(),
		 "Specify the start of the validity for this license. "
		 " Format YYYYMMDD. If not specified defaults to today")  //
		(PARAM_EXPIRY_DATE ",e", po::value<string>(),
		 "Specify the expire date for this license. "
		 " Format YYYYMMDD. If not specified the license won't expire")	 //
		(PARAM_CLIENT_SIGNATURE ",s", po::value<string>(),
		 "The signature of the hardware that requires the license. It should be in the format XXXX-XXXX-XXXX."
		 " If not specified the license won't be linked to a specific hardware (eg. demo license).")  //
		(PARAM_LICENSE_OUTPUT ",o", po::value<string>(&license_name),
		 "License output file name. May contain / that will be interpreded as subfolders.")	 //
		(PARAM_FEATURE_NAMES ",f", po::value<boost::optional<std::string>>(),
		 "Feature names: comma separate list of project features to enable. if not specified will be taken as project "
		 "name.")  //
		(PARAM_PRIMARY_KEY, po::value<string>(), "Primary key location, in case it is not in default folder")  //
		(PARAM_PROJECT_FOLDER ",p", po::value<string>(&project_folder)->default_value("."),
		 "path to where project configurations and licenses are stored.")  //
		(PARAM_VERSION_FROM, po::value<string>()->default_value("0", "All Versions"),
		 "Specify the first version of the software this license apply to.")  //
		(PARAM_VERSION_TO, po::value<string>()->default_value("0", "All Versions"),	 //
		 "Specify the last version of the software this license apply to.")	 //
		(PARAM_EXTRA_DATA ",x", po::value<string>(), "Specify extra data to be included into the license")	//
		("help,h", "Print this help.");	 //
	if (rerunBoostPO(parsed, license_desc, vm, argv, "license issue", global)) {
		if (!license_name.empty()) {
			license_name_ptr = &license_name;
		}
		License license(license_name_ptr, project_folder, base64);
		for (const auto &it : vm) {
			auto &value = it.second.value();
			if (it.first != "command" && it.first != "subargs" && it.first != "base64") {
				if (auto v = boost::any_cast<std::string>(&value)) {
					license.add_parameter(it.first, *v);
				} else if (auto v = boost::any_cast<boost::optional<std::string>>(value)) {
					license.add_parameter(it.first, *v);
				} else {
					std::cout << it.first << "not recognized value error" << endl;
				}
			}
		}
		try {
			license.write_license();
			cout << "License written " << endl;
		} catch (exception &ex) {
			cerr << "License writing error: " << ex.what() << endl;
		}
	}
}